

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void amrex::anon_unknown_12::anon_unknown_0::sgetval<amrex::IntVect>
               (Table *table,string *name,IntVect *ptr,int ival,int occurrence)

{
  bool bVar1;
  ostream *poVar2;
  char local_19;
  
  bVar1 = squeryval<amrex::IntVect>(table,name,ptr,ival,occurrence);
  if (!bVar1) {
    poVar2 = ErrorStream();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ParmParse::getval ",0x12);
    if (-1 < occurrence) {
      poVar2 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"occurrence number ",0x12);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," of ",4);
    }
    poVar2 = ErrorStream();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ParmParse::getval(): ",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," not found in table",0x13);
    local_19 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
    poVar2 = ErrorStream();
    ParmParse::dumpTable(poVar2,false);
    Abort_host((char *)0x0);
  }
  return;
}

Assistant:

void
sgetval (const ParmParse::Table& table,
         const std::string& name,
         T&           ptr,
         int          ival,
         int          occurrence)
{
    if ( squeryval(table, name,ptr,ival,occurrence) == 0 )
    {
        amrex::ErrorStream() << "ParmParse::getval ";
        if ( occurrence >= 0 )
        {
            amrex::ErrorStream() << "occurrence number "
                      << occurrence
                      << " of ";
        }

        amrex::ErrorStream() << "ParmParse::getval(): "
                  << name
                  << " not found in table"
                  << '\n';
        ParmParse::dumpTable(amrex::ErrorStream());
        amrex::Abort();
    }
}